

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon2.cxx
# Opt level: O0

int __thiscall Fl_File_Icon::load_image(Fl_File_Icon *this,char *ifile)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  Fl_Color FVar5;
  Fl_Shared_Image *this_00;
  char **ppcVar6;
  ulong uVar7;
  void *__s;
  long lVar8;
  int local_c4;
  byte *local_b8;
  uchar *cmapptr;
  int startx_1;
  int y_1;
  int x_1;
  int blue;
  int green;
  int red;
  Fl_Color *colors;
  int chars_per_color;
  int ncolors;
  char **ptr;
  char *lineptr;
  char val [16];
  int local_60;
  uint local_5c;
  int bg;
  int newch;
  int ch;
  int j;
  int i;
  int extra_data;
  uchar *row;
  Fl_Color local_38;
  Fl_Color temp;
  Fl_Color c;
  int startx;
  int y;
  int x;
  Fl_Shared_Image *img;
  char *ifile_local;
  Fl_File_Icon *this_local;
  
  this_00 = Fl_Shared_Image::get(ifile,0,0);
  if ((((this_00 == (Fl_Shared_Image *)0x0) ||
       (iVar3 = Fl_Image::count(&this_00->super_Fl_Image), iVar3 == 0)) ||
      (iVar3 = Fl_Image::w(&this_00->super_Fl_Image), iVar3 == 0)) ||
     (iVar3 = Fl_Image::h(&this_00->super_Fl_Image), iVar3 == 0)) {
    this_local._4_4_ = -1;
  }
  else {
    iVar3 = Fl_Image::count(&this_00->super_Fl_Image);
    if (iVar3 == 1) {
      iVar3 = Fl_Image::ld(&this_00->super_Fl_Image);
      if (iVar3 == 0) {
        local_c4 = 0;
      }
      else {
        local_c4 = Fl_Image::ld(&this_00->super_Fl_Image);
        iVar3 = Fl_Image::w(&this_00->super_Fl_Image);
        iVar4 = Fl_Image::d(&this_00->super_Fl_Image);
        local_c4 = local_c4 - iVar3 * iVar4;
      }
      c = 0;
      ppcVar6 = Fl_Image::data(&this_00->super_Fl_Image);
      _i = (uchar *)*ppcVar6;
      for (; iVar3 = Fl_Image::h(&this_00->super_Fl_Image), (int)c < iVar3; c = c + 1) {
        startx = 0;
        temp = 0;
        local_38 = 0xffffffff;
        while (iVar3 = Fl_Image::w(&this_00->super_Fl_Image), startx < iVar3) {
          iVar3 = Fl_Image::d(&this_00->super_Fl_Image);
          if (iVar3 == 1) {
            row._4_4_ = fl_rgb_color(*_i,*_i,*_i);
          }
          else if (iVar3 == 2) {
            if (_i[1] < 0x80) {
              row._4_4_ = 0xffffffff;
            }
            else {
              row._4_4_ = fl_rgb_color(*_i,*_i,*_i);
            }
          }
          else if (iVar3 == 3) {
            row._4_4_ = fl_rgb_color(*_i,_i[1],_i[2]);
          }
          else if (_i[3] < 0x80) {
            row._4_4_ = 0xffffffff;
          }
          else {
            row._4_4_ = fl_rgb_color(*_i,_i[1],_i[2]);
          }
          if (row._4_4_ != local_38) {
            if (((int)temp < startx) && (local_38 != 0xffffffff)) {
              add_color(this,local_38);
              add(this,4);
              iVar3 = Fl_Image::w(&this_00->super_Fl_Image);
              iVar4 = Fl_Image::h(&this_00->super_Fl_Image);
              add_vertex(this,(int)(temp * 9000) / iVar3 + 1000,0x251c - (int)(c * 9000) / iVar4);
              iVar3 = Fl_Image::w(&this_00->super_Fl_Image);
              iVar4 = Fl_Image::h(&this_00->super_Fl_Image);
              add_vertex(this,(startx * 9000) / iVar3 + 1000,0x251c - (int)(c * 9000) / iVar4);
              iVar3 = Fl_Image::w(&this_00->super_Fl_Image);
              iVar4 = Fl_Image::h(&this_00->super_Fl_Image);
              add_vertex(this,(startx * 9000) / iVar3 + 1000,0x251c - (int)((c + 1) * 9000) / iVar4)
              ;
              iVar3 = Fl_Image::w(&this_00->super_Fl_Image);
              iVar4 = Fl_Image::h(&this_00->super_Fl_Image);
              add_vertex(this,(int)(temp * 9000) / iVar3 + 1000,
                         0x251c - (int)((c + 1) * 9000) / iVar4);
              add(this,0);
            }
            local_38 = row._4_4_;
            temp = startx;
          }
          startx = startx + 1;
          iVar3 = Fl_Image::d(&this_00->super_Fl_Image);
          _i = _i + iVar3;
        }
        if (((int)temp < startx) && (local_38 != 0xffffffff)) {
          add_color(this,local_38);
          add(this,4);
          iVar3 = Fl_Image::w(&this_00->super_Fl_Image);
          iVar4 = Fl_Image::h(&this_00->super_Fl_Image);
          add_vertex(this,(int)(temp * 9000) / iVar3 + 1000,0x251c - (int)(c * 9000) / iVar4);
          iVar3 = Fl_Image::w(&this_00->super_Fl_Image);
          iVar4 = Fl_Image::h(&this_00->super_Fl_Image);
          add_vertex(this,(startx * 9000) / iVar3 + 1000,0x251c - (int)(c * 9000) / iVar4);
          iVar3 = Fl_Image::w(&this_00->super_Fl_Image);
          iVar4 = Fl_Image::h(&this_00->super_Fl_Image);
          add_vertex(this,(startx * 9000) / iVar3 + 1000,0x251c - (int)((c + 1) * 9000) / iVar4);
          iVar3 = Fl_Image::w(&this_00->super_Fl_Image);
          iVar4 = Fl_Image::h(&this_00->super_Fl_Image);
          add_vertex(this,(int)(temp * 9000) / iVar3 + 1000,0x251c - (int)((c + 1) * 9000) / iVar4);
          add(this,0);
        }
        _i = _i + local_c4;
      }
    }
    else {
      _chars_per_color = Fl_Image::data(&this_00->super_Fl_Image);
      __isoc99_sscanf(*_chars_per_color,"%*d%*d%d%d",(long)&colors + 4,&colors);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)(1 << ((byte)((int)colors << 3) & 0x1f));
      uVar7 = SUB168(auVar2 * ZEXT816(4),0);
      if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      __s = operator_new__(uVar7);
      memset(__s,0,4L << ((byte)((int)colors << 3) & 0x3f));
      local_60 = 0x20;
      _chars_per_color = _chars_per_color + 1;
      if (colors._4_4_ < 0) {
        colors._4_4_ = -colors._4_4_;
        ch = 0;
        local_b8 = (byte *)*_chars_per_color;
        for (; ch < colors._4_4_; ch = ch + 1) {
          FVar5 = fl_rgb_color(local_b8[1],local_b8[2],local_b8[3]);
          *(Fl_Color *)((long)__s + (ulong)*local_b8 * 4) = FVar5;
          local_b8 = local_b8 + 4;
        }
        _chars_per_color = _chars_per_color + 1;
      }
      else {
        for (ch = 0; ch < colors._4_4_; ch = ch + 1) {
          pcVar1 = *_chars_per_color;
          bg = (int)*pcVar1;
          ptr = (char **)(pcVar1 + 1);
          if (1 < (int)colors) {
            ptr = (char **)(pcVar1 + 2);
            bg = bg << 8 | (int)pcVar1[1];
          }
          ptr = (char **)strstr((char *)ptr,"c ");
          if (ptr == (char **)0x0) {
            *(undefined4 *)((long)__s + (long)bg * 4) = 0x38;
          }
          else if (*(char *)((long)ptr + 2) == '#') {
            ptr = (char **)((long)ptr + 3);
            newch = 0;
            while ((newch < 0xc &&
                   (iVar3 = isxdigit((int)*(char *)((long)ptr + (long)newch)), iVar3 != 0))) {
              newch = newch + 1;
            }
            switch(newch) {
            case 0:
              local_60 = bg;
            default:
              y_1._0_1_ = '\0';
              x_1._0_1_ = '\0';
              blue._0_1_ = '\0';
              break;
            case 3:
              lineptr._0_1_ = *(undefined1 *)ptr;
              lineptr._1_1_ = 0;
              lVar8 = strtol((char *)&lineptr,(char **)0x0,0x10);
              blue._0_1_ = (uchar)((lVar8 * 0xff) / 0xf);
              lineptr._0_1_ = *(undefined1 *)((long)ptr + 1);
              lineptr._1_1_ = 0;
              lVar8 = strtol((char *)&lineptr,(char **)0x0,0x10);
              x_1._0_1_ = (uchar)((lVar8 * 0xff) / 0xf);
              lineptr._0_1_ = *(undefined1 *)((long)ptr + 2);
              lineptr._1_1_ = 0;
              lVar8 = strtol((char *)&lineptr,(char **)0x0,0x10);
              y_1._0_1_ = (uchar)((lVar8 * 0xff) / 0xf);
              break;
            case 6:
            case 9:
            case 0xc:
              iVar3 = newch / 3;
              lineptr._0_1_ = *(undefined1 *)ptr;
              lineptr._1_1_ = *(undefined1 *)((long)ptr + 1);
              lineptr._2_1_ = 0;
              lVar8 = strtol((char *)&lineptr,(char **)0x0,0x10);
              blue._0_1_ = (uchar)lVar8;
              lineptr._0_1_ = *(undefined1 *)((long)ptr + (long)iVar3);
              lineptr._1_1_ = *(undefined1 *)((long)ptr + (long)(iVar3 + 1));
              lineptr._2_1_ = 0;
              lVar8 = strtol((char *)&lineptr,(char **)0x0,0x10);
              x_1._0_1_ = (uchar)lVar8;
              lineptr._0_1_ = *(undefined1 *)((long)ptr + (long)(iVar3 << 1));
              lineptr._1_1_ = *(undefined1 *)((long)ptr + (long)(iVar3 * 2 + 1));
              lineptr._2_1_ = 0;
              lVar8 = strtol((char *)&lineptr,(char **)0x0,0x10);
              y_1._0_1_ = (uchar)lVar8;
            }
            FVar5 = fl_rgb_color((uchar)blue,(uchar)x_1,(uchar)y_1);
            *(Fl_Color *)((long)__s + (long)bg * 4) = FVar5;
          }
          else {
            iVar3 = strncasecmp((char *)((long)ptr + 2),"white",5);
            if (iVar3 == 0) {
              *(undefined4 *)((long)__s + (long)bg * 4) = 0xff;
            }
            else {
              iVar3 = strncasecmp((char *)((long)ptr + 2),"black",5);
              if (iVar3 == 0) {
                *(undefined4 *)((long)__s + (long)bg * 4) = 0x38;
              }
              else {
                iVar3 = strncasecmp((char *)((long)ptr + 2),"none",4);
                if (iVar3 == 0) {
                  *(undefined4 *)((long)__s + (long)bg * 4) = 0x38;
                  local_60 = bg;
                }
                else {
                  *(undefined4 *)((long)__s + (long)bg * 4) = 0x31;
                }
              }
            }
          }
          _chars_per_color = _chars_per_color + 1;
        }
      }
      for (cmapptr._4_4_ = 0; iVar3 = Fl_Image::h(&this_00->super_Fl_Image), cmapptr._4_4_ < iVar3;
          cmapptr._4_4_ = cmapptr._4_4_ + 1) {
        ptr = (char **)*_chars_per_color;
        cmapptr._0_4_ = 0;
        bg = local_60;
        for (startx_1 = 0; iVar3 = Fl_Image::w(&this_00->super_Fl_Image), startx_1 < iVar3;
            startx_1 = startx_1 + 1) {
          local_5c = (uint)*(char *)ptr;
          ppcVar6 = (char **)((long)ptr + 1);
          if (1 < (int)colors) {
            local_5c = local_5c << 8 | (int)*(char *)((long)ptr + 1);
            ppcVar6 = (char **)((long)ptr + 2);
          }
          ptr = ppcVar6;
          if (local_5c != bg) {
            if (bg != local_60) {
              add_color(this,*(Fl_Color *)((long)__s + (long)bg * 4));
              add(this,4);
              iVar3 = Fl_Image::w(&this_00->super_Fl_Image);
              iVar4 = Fl_Image::h(&this_00->super_Fl_Image);
              add_vertex(this,((int)cmapptr * 9000) / iVar3 + 1000,
                         0x251c - (cmapptr._4_4_ * 9000) / iVar4);
              iVar3 = Fl_Image::w(&this_00->super_Fl_Image);
              iVar4 = Fl_Image::h(&this_00->super_Fl_Image);
              add_vertex(this,(startx_1 * 9000) / iVar3 + 1000,
                         0x251c - (cmapptr._4_4_ * 9000) / iVar4);
              iVar3 = Fl_Image::w(&this_00->super_Fl_Image);
              iVar4 = Fl_Image::h(&this_00->super_Fl_Image);
              add_vertex(this,(startx_1 * 9000) / iVar3 + 1000,
                         0x251c - ((cmapptr._4_4_ + 1) * 9000) / iVar4);
              iVar3 = Fl_Image::w(&this_00->super_Fl_Image);
              iVar4 = Fl_Image::h(&this_00->super_Fl_Image);
              add_vertex(this,((int)cmapptr * 9000) / iVar3 + 1000,
                         0x251c - ((cmapptr._4_4_ + 1) * 9000) / iVar4);
              add(this,0);
            }
            bg = local_5c;
            cmapptr._0_4_ = startx_1;
          }
        }
        if (bg != local_60) {
          add_color(this,*(Fl_Color *)((long)__s + (long)bg * 4));
          add(this,4);
          iVar3 = Fl_Image::w(&this_00->super_Fl_Image);
          iVar4 = Fl_Image::h(&this_00->super_Fl_Image);
          add_vertex(this,((int)cmapptr * 9000) / iVar3 + 1000,
                     0x251c - (cmapptr._4_4_ * 9000) / iVar4);
          iVar3 = Fl_Image::w(&this_00->super_Fl_Image);
          iVar4 = Fl_Image::h(&this_00->super_Fl_Image);
          add_vertex(this,(startx_1 * 9000) / iVar3 + 1000,0x251c - (cmapptr._4_4_ * 9000) / iVar4);
          iVar3 = Fl_Image::w(&this_00->super_Fl_Image);
          iVar4 = Fl_Image::h(&this_00->super_Fl_Image);
          add_vertex(this,(startx_1 * 9000) / iVar3 + 1000,
                     0x251c - ((cmapptr._4_4_ + 1) * 9000) / iVar4);
          iVar3 = Fl_Image::w(&this_00->super_Fl_Image);
          iVar4 = Fl_Image::h(&this_00->super_Fl_Image);
          add_vertex(this,((int)cmapptr * 9000) / iVar3 + 1000,
                     0x251c - ((cmapptr._4_4_ + 1) * 9000) / iVar4);
          add(this,0);
        }
        _chars_per_color = _chars_per_color + 1;
      }
      if (__s != (void *)0x0) {
        operator_delete__(__s);
      }
    }
    Fl_Shared_Image::release(this_00);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_File_Icon::load_image(const char *ifile)	// I - File to read from
{
  Fl_Shared_Image	*img;		// Image file


  img = Fl_Shared_Image::get(ifile);
  if (!img || !img->count() || !img->w() || !img->h()) return -1;

  if (img->count() == 1) {
    int		x, y;		// X & Y in image
    int		startx;		// Starting X coord
    Fl_Color	c,		// Current color
		temp;		// Temporary color
    const uchar *row;		// Pointer into image

    const int extra_data = img->ld() ? (img->ld()-img->w()*img->d()) : 0;

    // Loop through grayscale or RGB image...
    for (y = 0, row = (const uchar *)(*(img->data())); y < img->h(); y ++, row += extra_data)
    {
      for (x = 0, startx = 0, c = (Fl_Color)-1;
           x < img->w();
	   x ++, row += img->d())
      {
	switch (img->d())
	{
          case 1 :
              temp = fl_rgb_color(row[0], row[0], row[0]);
	      break;
          case 2 :
	      if (row[1] > 127)
        	temp = fl_rgb_color(row[0], row[0], row[0]);
	      else
		temp = (Fl_Color)-1;
	      break;
	  case 3 :
              temp = fl_rgb_color(row[0], row[1], row[2]);
	      break;
	  default :
	      if (row[3] > 127)
        	temp = fl_rgb_color(row[0], row[1], row[2]);
	      else
		temp = (Fl_Color)-1;
	      break;
	}

	if (temp != c)
	{
	  if (x > startx && c != (Fl_Color)-1)
	  {
	    add_color(c);
	    add(POLYGON);
	    add_vertex(startx * 9000 / img->w() + 1000, 9500 - y * 9000 / img->h());
	    add_vertex(x * 9000 / img->w() + 1000,      9500 - y * 9000 / img->h());
	    add_vertex(x * 9000 / img->w() + 1000,      9500 - (y + 1) * 9000 / img->h());
	    add_vertex(startx * 9000 / img->w() + 1000, 9500 - (y + 1) * 9000 / img->h());
	    add(END);
	  }

          c      = temp;
	  startx = x;
	}
      }

      if (x > startx && c != (Fl_Color)-1)
      {
	add_color(c);
	add(POLYGON);
	add_vertex(startx * 9000 / img->w() + 1000, 9500 - y * 9000 / img->h());
	add_vertex(x * 9000 / img->w() + 1000,      9500 - y * 9000 / img->h());
	add_vertex(x * 9000 / img->w() + 1000,      9500 - (y + 1) * 9000 / img->h());
	add_vertex(startx * 9000 / img->w() + 1000, 9500 - (y + 1) * 9000 / img->h());
	add(END);
      }
    }
  } else {
    int		i, j;			// Looping vars
    int		ch;			// Current character
    int		newch;			// New character
    int		bg;			// Background color
    char	val[16];		// Color value
    const char	*lineptr,		// Pointer into line
		*const*ptr;		// Pointer into data array
    int		ncolors,		// Number of colors
		chars_per_color;	// Characters per color
    Fl_Color	*colors;		// Colors
    int		red, green, blue;	// Red, green, and blue values
    int		x, y;			// X & Y in image
    int		startx;			// Starting X coord

    // Get the pixmap data...
    ptr = img->data();
    sscanf(*ptr, "%*d%*d%d%d", &ncolors, &chars_per_color);

    colors = new Fl_Color[1 << (chars_per_color * 8)];

    // Read the colormap...
    memset(colors, 0, sizeof(Fl_Color) << (chars_per_color * 8));
    bg = ' ';

    ptr ++;

    if (ncolors < 0) {
      // Read compressed colormap...
      const uchar *cmapptr;

      ncolors = -ncolors;

      for (i = 0, cmapptr = (const uchar *)*ptr; i < ncolors; i ++, cmapptr += 4)
        colors[cmapptr[0]] = fl_rgb_color(cmapptr[1], cmapptr[2], cmapptr[3]);

      ptr ++;
    } else {
      for (i = 0; i < ncolors; i ++, ptr ++) {
	// Get the color's character
	lineptr = *ptr;
	ch      = *lineptr++;

        if (chars_per_color > 1) ch = (ch << 8) | *lineptr++;

	// Get the color value...
	if ((lineptr = strstr(lineptr, "c ")) == NULL) {
	  // No color; make this black...
	  colors[ch] = FL_BLACK;
	} else if (lineptr[2] == '#') {
	  // Read the RGB triplet...
	  lineptr += 3;
	  for (j = 0; j < 12; j ++)
            if (!isxdigit(lineptr[j]))
	      break;

	  switch (j) {
            case 0 :
		bg = ch;
	    default :
		red = green = blue = 0;
		break;

            case 3 :
		val[0] = lineptr[0];
		val[1] = '\0';
		red = 255 * strtol(val, NULL, 16) / 15;

		val[0] = lineptr[1];
		val[1] = '\0';
		green = 255 * strtol(val, NULL, 16) / 15;

		val[0] = lineptr[2];
		val[1] = '\0';
		blue = 255 * strtol(val, NULL, 16) / 15;
		break;

            case 6 :
            case 9 :
            case 12 :
		j /= 3;

		val[0] = lineptr[0];
		val[1] = lineptr[1];
		val[2] = '\0';
		red = strtol(val, NULL, 16);

		val[0] = lineptr[j + 0];
		val[1] = lineptr[j + 1];
		val[2] = '\0';
		green = strtol(val, NULL, 16);

		val[0] = lineptr[2 * j + 0];
		val[1] = lineptr[2 * j + 1];
		val[2] = '\0';
		blue = strtol(val, NULL, 16);
		break;
	  }

	  colors[ch] = fl_rgb_color((uchar)red, (uchar)green, (uchar)blue);
	} else {
	  // Read a color name...
	  if (strncasecmp(lineptr + 2, "white", 5) == 0) colors[ch] = FL_WHITE;
	  else if (strncasecmp(lineptr + 2, "black", 5) == 0) colors[ch] = FL_BLACK;
	  else if (strncasecmp(lineptr + 2, "none", 4) == 0) {
            colors[ch] = FL_BLACK;
	    bg = ch;
	  } else colors[ch] = FL_GRAY;
	}
      }
    }

    // Read the image data...
    for (y = 0; y < img->h(); y ++, ptr ++) {
      lineptr = *ptr;
      startx  = 0;
      ch      = bg;

      for (x = 0; x < img->w(); x ++) {
	newch = *lineptr++;

        if (chars_per_color > 1) newch = (newch << 8) | *lineptr++;

	if (newch != ch) {
	  if (ch != bg) {
            add_color(colors[ch]);
	    add(POLYGON);
	    add_vertex(startx * 9000 / img->w() + 1000, 9500 - y * 9000 / img->h());
	    add_vertex(x * 9000 / img->w() + 1000,      9500 - y * 9000 / img->h());
	    add_vertex(x * 9000 / img->w() + 1000,      9500 - (y + 1) * 9000 / img->h());
	    add_vertex(startx * 9000 / img->w() + 1000, 9500 - (y + 1) * 9000 / img->h());
	    add(END);
          }

	  ch     = newch;
	  startx = x;
	}
      }

      if (ch != bg) {
	add_color(colors[ch]);
	add(POLYGON);
	add_vertex(startx * 9000 / img->w() + 1000, 9500 - y * 9000 / img->h());
	add_vertex(x * 9000 / img->w() + 1000,      9500 - y * 9000 / img->h());
	add_vertex(x * 9000 / img->w() + 1000,      9500 - (y + 1) * 9000 / img->h());
	add_vertex(startx * 9000 / img->w() + 1000, 9500 - (y + 1) * 9000 / img->h());
	add(END);
      }
    }

    // Free the colormap...
    delete[] colors;
  }

  img->release();

#ifdef DEBUG
{
  int i;
  printf("Icon File \"%s\":\n", ifile);
  for (i = 0; i < num_data_; i ++)
  {
    printf("    %d,\n", data_[i]);
  }
}
#endif // DEBUG

  return 0;
}